

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_flip_inplace_closed
               (roaring_bitmap_t *x1,uint32_t range_start,uint32_t range_end)

{
  bitset_container_t *c;
  _Bool _Var1;
  int iVar2;
  array_container_t *src;
  run_container_t *c_00;
  uint16_t lb_start;
  uint8_t typecode;
  uint uVar3;
  uint uVar4;
  uint8_t local_4d;
  uint32_t local_4c;
  bitset_container_t *local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint16_t hb;
  
  if (range_start <= range_end) {
    uVar3 = range_start >> 0x10;
    uVar4 = range_end >> 0x10;
    lb_start = (uint16_t)range_start;
    hb = (uint16_t)(range_start >> 0x10);
    if (uVar3 == uVar4) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,(uint16_t)range_end);
      return;
    }
    local_4c = range_end;
    if (lb_start != 0) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,0xffff);
      uVar3 = uVar3 + 1 & 0xffff;
    }
    local_38 = local_4c & 0xffff;
    local_3c = uVar4 + 0xffff;
    local_34 = local_3c & 0xffff;
    if (local_38 == 0xffff) {
      local_34 = uVar4;
    }
    for (; uVar3 <= local_34; uVar3 = uVar3 + 1) {
      uVar4 = ra_get_index(&x1->high_low_container,(uint16_t)uVar3);
      if ((int)uVar4 < 0) {
        c_00 = run_container_create_range(0,0x10000);
        ra_insert_new_key_value_at(&x1->high_low_container,~uVar4,(uint16_t)uVar3,c_00,'\x03');
      }
      else {
        local_4d = (x1->high_low_container).typecodes[uVar4 & 0xffff];
        src = (array_container_t *)
              get_writable_copy_if_shared
                        ((x1->high_low_container).containers[uVar4 & 0xffff],&local_4d);
        local_48 = (bitset_container_t *)0x0;
        if (local_4d == '\x03') {
          iVar2 = run_container_negation_inplace((run_container_t *)src,&local_48);
          typecode = (uint8_t)iVar2;
        }
        else if (local_4d == '\x02') {
          local_48 = bitset_container_create();
          array_container_negation(src,local_48);
          array_container_free(src);
          typecode = '\x01';
        }
        else {
          _Var1 = bitset_container_negation_inplace((bitset_container_t *)src,&local_48);
          typecode = '\x02' - _Var1;
        }
        c = local_48;
        iVar2 = container_get_cardinality(local_48,typecode);
        if (iVar2 == 0) {
          container_free(c,typecode);
          ra_remove_at_index(&x1->high_low_container,uVar4);
        }
        else {
          (x1->high_low_container).containers[uVar4] = c;
          (x1->high_low_container).typecodes[uVar4] = typecode;
        }
      }
    }
    if (local_38 != 0xffff) {
      inplace_flip_container(&x1->high_low_container,(short)local_3c + 1,0,(uint16_t)local_4c);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_flip_inplace_closed(roaring_bitmap_t *x1,
                                        uint32_t range_start,
                                        uint32_t range_end) {
    if (range_start > range_end) {
        return;  // empty range
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)(range_end >> 16);
    const uint16_t lb_end = (uint16_t)range_end;

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, (uint16_t)hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}